

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Reader::DoGetStructSync
          (BP5Reader *this,VariableStruct *variable,void *data)

{
  int iVar1;
  ScopedTimer __var21692;
  ScopedTimer local_20;
  
  if (DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    if (iVar1 != 0) {
      DoGetStructSync::__var1692 = (void *)ps_timer_create_("BP5Reader::Get");
      __cxa_guard_release(&DoGetStructSync(adios2::core::VariableStruct&,void*)::__var1692);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_20,DoGetStructSync::__var1692);
  GetSyncCommon(this,&variable->super_VariableBase,data);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_20);
  return;
}

Assistant:

void BP5Reader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    GetSyncCommon(variable, data);
}